

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O0

void __thiscall QTreeViewPrivate::collapse(QTreeViewPrivate *this,int item,bool emitSignal)

{
  State SVar1;
  bool bVar2;
  const_reference pQVar3;
  reference pQVar4;
  byte in_DL;
  int in_ESI;
  QTreeViewPrivate *in_RDI;
  long in_FS_OFFSET;
  bool bVar5;
  int index;
  QModelIndex *modelIndex;
  int total;
  QTreeView *q;
  iterator it;
  undefined4 in_stack_ffffffffffffff58;
  State in_stack_ffffffffffffff5c;
  QAbstractItemView *in_stack_ffffffffffffff60;
  QSet<QPersistentModelIndex> *this_00;
  QModelIndex *in_stack_ffffffffffffff68;
  undefined7 in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff77;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  QTreeViewPrivate *pQVar6;
  QTreeViewPrivate *in_stack_ffffffffffffffb0;
  QPersistentModelIndex local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar6 = in_RDI;
  q_func(in_RDI);
  if ((in_ESI != -1) &&
     (bVar2 = QSet<QPersistentModelIndex>::isEmpty((QSet<QPersistentModelIndex> *)0x8f1e29), !bVar2)
     ) {
    QBasicTimer::stop();
    pQVar3 = QList<QTreeViewItem>::at
                       ((QList<QTreeViewItem> *)in_stack_ffffffffffffff60,
                        CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    SVar1 = (State)(*(ulong *)&pQVar3->field_0x1c >> 4);
    pQVar3 = QList<QTreeViewItem>::at
                       ((QList<QTreeViewItem> *)in_stack_ffffffffffffff60,
                        CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    bVar2 = QAbstractItemViewPrivate::isPersistent
                      ((QAbstractItemViewPrivate *)
                       CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70),
                       in_stack_ffffffffffffff68);
    if (bVar2) {
      local_18 = &DAT_aaaaaaaaaaaaaaaa;
      local_10 = &DAT_aaaaaaaaaaaaaaaa;
      QPersistentModelIndex::QPersistentModelIndex(&local_20,(QModelIndex *)pQVar3);
      QSet<QPersistentModelIndex>::find
                ((QSet<QPersistentModelIndex> *)in_RDI,
                 (QPersistentModelIndex *)
                 CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70));
      QPersistentModelIndex::~QPersistentModelIndex(&local_20);
      QSet<QPersistentModelIndex>::end((QSet<QPersistentModelIndex> *)in_RDI);
      bVar2 = QSet<QPersistentModelIndex>::iterator::operator==
                        ((iterator *)in_stack_ffffffffffffff60,
                         (iterator *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
      bVar5 = true;
      if (!bVar2) {
        pQVar3 = QList<QTreeViewItem>::at
                           ((QList<QTreeViewItem> *)in_stack_ffffffffffffff60,
                            CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
        bVar5 = (*(ulong *)&pQVar3->field_0x1c & 1) == 0;
      }
      if (!bVar5) {
        if (((in_DL & 1) != 0) && ((in_RDI->animationsEnabled & 1U) != 0)) {
          prepareAnimatedOperation
                    (in_stack_ffffffffffffffb0,(int)((ulong)pQVar6 >> 0x20),(Direction)pQVar6);
        }
        if ((in_RDI->super_QAbstractItemViewPrivate).state != AnimatingState) {
          (in_RDI->super_QAbstractItemViewPrivate).stateBeforeAnimation =
               (in_RDI->super_QAbstractItemViewPrivate).state;
        }
        QAbstractItemView::setState(in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
        this_00 = &in_RDI->expandedIndexes;
        QSet<QPersistentModelIndex>::const_iterator::const_iterator
                  ((const_iterator *)this_00,
                   (iterator *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
        QSet<QPersistentModelIndex>::erase
                  ((QSet<QPersistentModelIndex> *)
                   CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                   (const_iterator *)in_RDI);
        pQVar4 = QList<QTreeViewItem>::operator[]
                           ((QList<QTreeViewItem> *)this_00,
                            CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
        *(ulong *)&pQVar4->field_0x1c = *(ulong *)&pQVar4->field_0x1c & 0xfffffffffffffffe;
        while (-1 < in_ESI) {
          in_stack_ffffffffffffff5c = SVar1 & 0xfffffff;
          pQVar4 = QList<QTreeViewItem>::operator[]
                             ((QList<QTreeViewItem> *)this_00,
                              CONCAT44(SVar1,in_stack_ffffffffffffff58) & 0xfffffffffffffff);
          *(ulong *)&pQVar4->field_0x1c =
               *(ulong *)&pQVar4->field_0x1c & 0xffffffff0000000f |
               ((ulong)(((uint)(*(ulong *)&pQVar4->field_0x1c >> 4) & 0xfffffff) -
                       in_stack_ffffffffffffff5c) & 0xfffffff) << 4;
          pQVar4 = QList<QTreeViewItem>::operator[]
                             ((QList<QTreeViewItem> *)this_00,
                              CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
          in_ESI = pQVar4->parentItem;
        }
        removeViewItems((QTreeViewPrivate *)CONCAT44(in_ESI,in_stack_ffffffffffffff80),
                        (int)((ulong)in_RDI >> 0x20),(int)in_RDI);
        QAbstractItemView::setState((QAbstractItemView *)this_00,in_stack_ffffffffffffff5c);
        if (((in_DL & 1) != 0) &&
           (QTreeView::collapsed
                      ((QTreeView *)this_00,
                       (QModelIndex *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58))
           , (in_RDI->animationsEnabled & 1U) != 0)) {
          beginAnimatedOperation((QTreeViewPrivate *)CONCAT44(in_ESI,in_stack_ffffffffffffff80));
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTreeViewPrivate::collapse(int item, bool emitSignal)
{
    Q_Q(QTreeView);

    if (item == -1 || expandedIndexes.isEmpty())
        return;

    //if the current item is now invisible, the autoscroll will expand the tree to see it, so disable the autoscroll
    delayedAutoScroll.stop();

    int total = viewItems.at(item).total;
    const QModelIndex &modelIndex = viewItems.at(item).index;
    if (!isPersistent(modelIndex))
        return; // if the index is not persistent, no chances it is expanded
    QSet<QPersistentModelIndex>::iterator it = expandedIndexes.find(modelIndex);
    if (it == expandedIndexes.end() || viewItems.at(item).expanded == false)
        return; // nothing to do

#if QT_CONFIG(animation)
    if (emitSignal && animationsEnabled)
        prepareAnimatedOperation(item, QVariantAnimation::Backward);
#endif // animation

    //if already animating, stateBeforeAnimation is set to the correct value
    if (state != QAbstractItemView::AnimatingState)
        stateBeforeAnimation = state;
    q->setState(QAbstractItemView::CollapsingState);
    expandedIndexes.erase(it);
    viewItems[item].expanded = false;
    int index = item;
    while (index > -1) {
        viewItems[index].total -= total;
        index = viewItems[index].parentItem;
    }
    removeViewItems(item + 1, total); // collapse
    q->setState(stateBeforeAnimation);

    if (emitSignal) {
        emit q->collapsed(modelIndex);
#if QT_CONFIG(animation)
        if (animationsEnabled)
            beginAnimatedOperation();
#endif // animation
    }
}